

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

xmlChar * xmlParseNameComplex(xmlParserCtxtPtr ctxt)

{
  uint val;
  int iVar1;
  bool bVar2;
  uint local_34;
  bool local_2b;
  int local_28;
  uint local_24;
  int count;
  int c;
  int l;
  int len;
  xmlParserCtxtPtr ctxt_local;
  
  c = 0;
  local_28 = 0;
  _l = ctxt;
  if ((ctxt->progressive == 0) && ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
    xmlGROW(ctxt);
  }
  if (_l->instate == XML_PARSER_EOF) {
    return (xmlChar *)0x0;
  }
  val = xmlCurrentChar(_l,&count);
  if ((_l->options & 0x20000U) == 0) {
    if ((((val == 0x20) || (val == 0x3e)) || (val == 0x2f)) ||
       ((((((((int)val < 0x61 || (0x7a < (int)val)) && (((int)val < 0x41 || (0x5a < (int)val)))) &&
           ((val != 0x5f && (val != 0x3a)))) && (((int)val < 0xc0 || (0xd6 < (int)val)))) &&
         (((((int)val < 0xd8 || (0xf6 < (int)val)) && (((int)val < 0xf8 || (0x2ff < (int)val)))) &&
          (((int)val < 0x370 || (0x37d < (int)val)))))) &&
        ((((int)val < 0x37f || (0x1fff < (int)val)) &&
         (((((int)val < 0x200c || (0x200d < (int)val)) &&
           (((int)val < 0x2070 || (0x218f < (int)val)))) &&
          (((((int)val < 0x2c00 || (0x2fef < (int)val)) &&
            (((int)val < 0x3001 || (0xd7ff < (int)val)))) &&
           (((((int)val < 0xf900 || (0xfdcf < (int)val)) &&
             (((int)val < 0xfdf0 || (0xfffd < (int)val)))) &&
            (((int)val < 0x10000 || (0xeffff < (int)val)))))))))))))) {
      return (xmlChar *)0x0;
    }
    c = count + c;
    if (*_l->input->cur == '\n') {
      _l->input->line = _l->input->line + 1;
      _l->input->col = 1;
    }
    else {
      _l->input->col = _l->input->col + 1;
    }
    _l->input->cur = _l->input->cur + count;
    local_24 = xmlCurrentChar(_l,&count);
    while( true ) {
      local_2b = false;
      if (((((((local_24 != 0x20) && (local_2b = false, local_24 != 0x3e)) &&
             (local_2b = false, local_24 != 0x2f)) &&
            (((int)local_24 < 0x61 || (local_2b = true, 0x7a < (int)local_24)))) &&
           (((int)local_24 < 0x41 || (local_2b = true, 0x5a < (int)local_24)))) &&
          ((((int)local_24 < 0x30 || (local_2b = true, 0x39 < (int)local_24)) &&
           (local_2b = true, local_24 != 0x5f)))) &&
         ((((((((local_2b = true, local_24 != 0x3a && (local_2b = true, local_24 != 0x2d)) &&
               (local_2b = true, local_24 != 0x2e)) &&
              ((local_2b = true, local_24 != 0xb7 &&
               (((int)local_24 < 0xc0 || (local_2b = true, 0xd6 < (int)local_24)))))) &&
             (((int)local_24 < 0xd8 || (local_2b = true, 0xf6 < (int)local_24)))) &&
            (((int)local_24 < 0xf8 || (local_2b = true, 0x2ff < (int)local_24)))) &&
           ((((int)local_24 < 0x300 || (local_2b = true, 0x36f < (int)local_24)) &&
            (((int)local_24 < 0x370 || (local_2b = true, 0x37d < (int)local_24)))))) &&
          (((((int)local_24 < 0x37f || (local_2b = true, 0x1fff < (int)local_24)) &&
            (((((int)local_24 < 0x200c || (local_2b = true, 0x200d < (int)local_24)) &&
              (((int)local_24 < 0x203f || (local_2b = true, 0x2040 < (int)local_24)))) &&
             ((((int)local_24 < 0x2070 || (local_2b = true, 0x218f < (int)local_24)) &&
              (((int)local_24 < 0x2c00 || (local_2b = true, 0x2fef < (int)local_24)))))))) &&
           (((((int)local_24 < 0x3001 || (local_2b = true, 0xd7ff < (int)local_24)) &&
             (((int)local_24 < 0xf900 || (local_2b = true, 0xfdcf < (int)local_24)))) &&
            (((int)local_24 < 0xfdf0 || (local_2b = true, 0xfffd < (int)local_24)))))))))) {
        local_2b = 0xffff < (int)local_24 && (int)local_24 < 0xf0000;
      }
      if (!local_2b) break;
      bVar2 = 100 < local_28;
      local_28 = local_28 + 1;
      if (bVar2) {
        local_28 = 0;
        if ((_l->progressive == 0) && ((long)_l->input->end - (long)_l->input->cur < 0xfa)) {
          xmlGROW(_l);
        }
        if (_l->instate == XML_PARSER_EOF) {
          return (xmlChar *)0x0;
        }
      }
      c = count + c;
      if (*_l->input->cur == '\n') {
        _l->input->line = _l->input->line + 1;
        _l->input->col = 1;
      }
      else {
        _l->input->col = _l->input->col + 1;
      }
      _l->input->cur = _l->input->cur + count;
      local_24 = xmlCurrentChar(_l,&count);
    }
LAB_001788e6:
    if ((c < 0xc351) || ((_l->options & 0x80000U) != 0)) {
      if ((long)_l->input->cur - (long)_l->input->base < (long)c) {
        xmlFatalErr(_l,XML_ERR_INTERNAL_ERROR,"unexpected change of input buffer");
        ctxt_local = (xmlParserCtxtPtr)0x0;
      }
      else if ((*_l->input->cur == '\n') && (_l->input->cur[-1] == '\r')) {
        ctxt_local = (xmlParserCtxtPtr)xmlDictLookup(_l->dict,_l->input->cur + -(long)(c + 1),c);
      }
      else {
        ctxt_local = (xmlParserCtxtPtr)xmlDictLookup(_l->dict,_l->input->cur + -(long)c,c);
      }
    }
    else {
      xmlFatalErr(_l,XML_ERR_NAME_TOO_LONG,"Name");
      ctxt_local = (xmlParserCtxtPtr)0x0;
    }
    return (xmlChar *)ctxt_local;
  }
  if (((val != 0x20) && (val != 0x3e)) && (val != 0x2f)) {
    if ((int)val < 0x100) {
      if (((((0x40 < (int)val) && ((int)val < 0x5b)) || ((0x60 < (int)val && ((int)val < 0x7b)))) ||
          (((0xbf < (int)val && ((int)val < 0xd7)) || ((0xd7 < (int)val && ((int)val < 0xf7)))))) ||
         (0xf7 < (int)val)) goto LAB_00178552;
    }
    else {
      iVar1 = xmlCharInRange(val,&xmlIsBaseCharGroup);
      if (iVar1 != 0) goto LAB_00178552;
    }
    if (((0xff < (int)val) &&
        ((((0x4dff < (int)val && ((int)val < 0x9fa6)) || (val == 0x3007)) ||
         ((0x3020 < (int)val && ((int)val < 0x302a)))))) || ((val == 0x5f || (val == 0x3a)))) {
LAB_00178552:
      c = count + c;
      if (*_l->input->cur == '\n') {
        _l->input->line = _l->input->line + 1;
        _l->input->col = 1;
      }
      else {
        _l->input->col = _l->input->col + 1;
      }
      _l->input->cur = _l->input->cur + count;
      local_24 = xmlCurrentChar(_l,&count);
      do {
        bVar2 = false;
        if (((local_24 != 0x20) && (bVar2 = false, local_24 != 0x3e)) &&
           (bVar2 = false, local_24 != 0x2f)) {
          if ((int)local_24 < 0x100) {
            if ((((int)local_24 < 0x41) || (bVar2 = true, 0x5a < (int)local_24)) &&
               (((((int)local_24 < 0x61 || (bVar2 = true, 0x7a < (int)local_24)) &&
                 ((((int)local_24 < 0xc0 || (bVar2 = true, 0xd6 < (int)local_24)) &&
                  (((int)local_24 < 0xd8 || (bVar2 = true, 0xf6 < (int)local_24)))))) &&
                (bVar2 = true, (int)local_24 < 0xf8)))) {
LAB_0017869f:
              if (((int)local_24 < 0x100) ||
                 (((((int)local_24 < 0x4e00 || (bVar2 = true, 0x9fa5 < (int)local_24)) &&
                   (bVar2 = true, local_24 != 0x3007)) &&
                  (((int)local_24 < 0x3021 || (bVar2 = true, 0x3029 < (int)local_24)))))) {
                if ((int)local_24 < 0x100) {
                  if (((int)local_24 < 0x30) || (bVar2 = true, 0x39 < (int)local_24)) {
LAB_00178747:
                    bVar2 = true;
                    if ((local_24 != 0x2e) &&
                       (((bVar2 = true, local_24 != 0x2d && (bVar2 = true, local_24 != 0x5f)) &&
                        (bVar2 = true, local_24 != 0x3a)))) {
                      if (0xff < (int)local_24) {
                        iVar1 = xmlCharInRange(local_24,&xmlIsCombiningGroup);
                        bVar2 = true;
                        if (iVar1 != 0) goto LAB_001787ee;
                      }
                      if ((int)local_24 < 0x100) {
                        local_34 = (uint)(local_24 == 0xb7);
                      }
                      else {
                        local_34 = xmlCharInRange(local_24,&xmlIsExtenderGroup);
                      }
                      bVar2 = local_34 != 0;
                    }
                  }
                }
                else {
                  iVar1 = xmlCharInRange(local_24,&xmlIsDigitGroup);
                  bVar2 = true;
                  if (iVar1 == 0) goto LAB_00178747;
                }
              }
            }
          }
          else {
            iVar1 = xmlCharInRange(local_24,&xmlIsBaseCharGroup);
            bVar2 = true;
            if (iVar1 == 0) goto LAB_0017869f;
          }
        }
LAB_001787ee:
        if (!bVar2) goto LAB_001788e6;
        bVar2 = 100 < local_28;
        local_28 = local_28 + 1;
        if (bVar2) {
          local_28 = 0;
          if ((_l->progressive == 0) && ((long)_l->input->end - (long)_l->input->cur < 0xfa)) {
            xmlGROW(_l);
          }
          if (_l->instate == XML_PARSER_EOF) {
            return (xmlChar *)0x0;
          }
        }
        c = count + c;
        if (*_l->input->cur == '\n') {
          _l->input->line = _l->input->line + 1;
          _l->input->col = 1;
        }
        else {
          _l->input->col = _l->input->col + 1;
        }
        _l->input->cur = _l->input->cur + count;
        local_24 = xmlCurrentChar(_l,&count);
      } while( true );
    }
  }
  return (xmlChar *)0x0;
}

Assistant:

static const xmlChar *
xmlParseNameComplex(xmlParserCtxtPtr ctxt) {
    int len = 0, l;
    int c;
    int count = 0;

#ifdef DEBUG
    nbParseNameComplex++;
#endif

    /*
     * Handler for more complex cases
     */
    GROW;
    if (ctxt->instate == XML_PARSER_EOF)
        return(NULL);
    c = CUR_CHAR(l);
    if ((ctxt->options & XML_PARSE_OLD10) == 0) {
        /*
	 * Use the new checks of production [4] [4a] amd [5] of the
	 * Update 5 of XML-1.0
	 */
	if ((c == ' ') || (c == '>') || (c == '/') || /* accelerators */
	    (!(((c >= 'a') && (c <= 'z')) ||
	       ((c >= 'A') && (c <= 'Z')) ||
	       (c == '_') || (c == ':') ||
	       ((c >= 0xC0) && (c <= 0xD6)) ||
	       ((c >= 0xD8) && (c <= 0xF6)) ||
	       ((c >= 0xF8) && (c <= 0x2FF)) ||
	       ((c >= 0x370) && (c <= 0x37D)) ||
	       ((c >= 0x37F) && (c <= 0x1FFF)) ||
	       ((c >= 0x200C) && (c <= 0x200D)) ||
	       ((c >= 0x2070) && (c <= 0x218F)) ||
	       ((c >= 0x2C00) && (c <= 0x2FEF)) ||
	       ((c >= 0x3001) && (c <= 0xD7FF)) ||
	       ((c >= 0xF900) && (c <= 0xFDCF)) ||
	       ((c >= 0xFDF0) && (c <= 0xFFFD)) ||
	       ((c >= 0x10000) && (c <= 0xEFFFF))))) {
	    return(NULL);
	}
	len += l;
	NEXTL(l);
	c = CUR_CHAR(l);
	while ((c != ' ') && (c != '>') && (c != '/') && /* accelerators */
	       (((c >= 'a') && (c <= 'z')) ||
	        ((c >= 'A') && (c <= 'Z')) ||
	        ((c >= '0') && (c <= '9')) || /* !start */
	        (c == '_') || (c == ':') ||
	        (c == '-') || (c == '.') || (c == 0xB7) || /* !start */
	        ((c >= 0xC0) && (c <= 0xD6)) ||
	        ((c >= 0xD8) && (c <= 0xF6)) ||
	        ((c >= 0xF8) && (c <= 0x2FF)) ||
	        ((c >= 0x300) && (c <= 0x36F)) || /* !start */
	        ((c >= 0x370) && (c <= 0x37D)) ||
	        ((c >= 0x37F) && (c <= 0x1FFF)) ||
	        ((c >= 0x200C) && (c <= 0x200D)) ||
	        ((c >= 0x203F) && (c <= 0x2040)) || /* !start */
	        ((c >= 0x2070) && (c <= 0x218F)) ||
	        ((c >= 0x2C00) && (c <= 0x2FEF)) ||
	        ((c >= 0x3001) && (c <= 0xD7FF)) ||
	        ((c >= 0xF900) && (c <= 0xFDCF)) ||
	        ((c >= 0xFDF0) && (c <= 0xFFFD)) ||
	        ((c >= 0x10000) && (c <= 0xEFFFF))
		)) {
	    if (count++ > XML_PARSER_CHUNK_SIZE) {
		count = 0;
		GROW;
                if (ctxt->instate == XML_PARSER_EOF)
                    return(NULL);
	    }
	    len += l;
	    NEXTL(l);
	    c = CUR_CHAR(l);
	}
    } else {
	if ((c == ' ') || (c == '>') || (c == '/') || /* accelerators */
	    (!IS_LETTER(c) && (c != '_') &&
	     (c != ':'))) {
	    return(NULL);
	}
	len += l;
	NEXTL(l);
	c = CUR_CHAR(l);

	while ((c != ' ') && (c != '>') && (c != '/') && /* test bigname.xml */
	       ((IS_LETTER(c)) || (IS_DIGIT(c)) ||
		(c == '.') || (c == '-') ||
		(c == '_') || (c == ':') ||
		(IS_COMBINING(c)) ||
		(IS_EXTENDER(c)))) {
	    if (count++ > XML_PARSER_CHUNK_SIZE) {
		count = 0;
		GROW;
                if (ctxt->instate == XML_PARSER_EOF)
                    return(NULL);
	    }
	    len += l;
	    NEXTL(l);
	    c = CUR_CHAR(l);
	}
    }
    if ((len > XML_MAX_NAME_LENGTH) &&
        ((ctxt->options & XML_PARSE_HUGE) == 0)) {
        xmlFatalErr(ctxt, XML_ERR_NAME_TOO_LONG, "Name");
        return(NULL);
    }
    if (ctxt->input->cur - ctxt->input->base < len) {
        /*
         * There were a couple of bugs where PERefs lead to to a change
         * of the buffer. Check the buffer size to avoid passing an invalid
         * pointer to xmlDictLookup.
         */
        xmlFatalErr(ctxt, XML_ERR_INTERNAL_ERROR,
                    "unexpected change of input buffer");
        return (NULL);
    }
    if ((*ctxt->input->cur == '\n') && (ctxt->input->cur[-1] == '\r'))
        return(xmlDictLookup(ctxt->dict, ctxt->input->cur - (len + 1), len));
    return(xmlDictLookup(ctxt->dict, ctxt->input->cur - len, len));
}